

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructReader * __thiscall
capnp::_::OrphanBuilder::asStructReader
          (StructReader *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  CapTableReader *pCVar4;
  ReadLimiter *pRVar5;
  word *pwVar6;
  Arena *pAVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  OrphanBuilder *pOVar16;
  SegmentBuilder **ppSVar17;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar18;
  SegmentBuilder *local_68;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  Fault f_2;
  
  local_68 = this->segment;
  pCVar4 = &this->capTable->super_CapTableReader;
  ppSVar17 = (SegmentBuilder **)this->location;
  uVar10 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar10 == 0) goto LAB_0020e255;
  if ((uVar10 & 3) == 2 && local_68 != (SegmentBuilder *)0x0) {
    iVar9 = (*((local_68->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_68 = (SegmentBuilder *)CONCAT44(extraout_var,iVar9);
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (SegmentBuilder *)0x0;
    if (local_68 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      _kjCondition.left = (SegmentReader **)&local_68;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar10 = (uint)(this->tag).content;
      uVar15 = (ulong)(uVar10 >> 3);
      uVar13 = (local_68->super_SegmentReader).ptr.size_;
      if ((long)uVar13 < (long)uVar15) {
        uVar15 = uVar13;
      }
      uVar12 = 2 - (ulong)((uVar10 & 4) == 0);
      _kjCondition.left = (SegmentReader **)&local_68;
      if (uVar15 + uVar12 <= uVar13) {
        pOVar16 = (OrphanBuilder *)((local_68->super_SegmentReader).ptr.ptr + uVar15);
        pRVar5 = (local_68->super_SegmentReader).readLimiter;
        uVar13 = pRVar5->limit;
        if (uVar12 <= uVar13) {
          pRVar5->limit = uVar13 - uVar12;
          if (((this->tag).content & 4) != 0) {
            pAVar7 = (local_68->super_SegmentReader).arena;
            _kjCondition.left = (SegmentReader **)&local_68;
            iVar9 = (*pAVar7->_vptr_Arena[2])
                              (pAVar7,(ulong)*(uint *)((long)&(pOVar16->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar9);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0020e45e:
              ppSVar17 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar10 = (uint)(pOVar16->tag).content;
              uVar11 = uVar10 & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar11);
              _kjCondition.right = anon_var_dwarf_b08b;
              _kjCondition.op.content.ptr = &DAT_00000005;
              _kjCondition.op.content.size_ = (size_t)(uVar11 == 2);
              if (uVar11 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_0020e45e;
              }
              uVar13 = (ulong)(uVar10 >> 3);
              sVar8 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar8 < (long)uVar13) {
                uVar13 = sVar8;
              }
              ppSVar17 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar13);
              local_68 = (SegmentBuilder *)newSegment;
            }
            this = (OrphanBuilder *)&pOVar16->segment;
            goto LAB_0020e130;
          }
          ppSVar1 = &pOVar16->segment;
          uVar10 = (uint)(pOVar16->tag).content;
          lVar14 = (long)((int)uVar10 >> 2);
          this = pOVar16;
          if ((local_68 != (SegmentBuilder *)0x0) &&
             ((pwVar6 = (local_68->super_SegmentReader).ptr.ptr,
              ppSVar17 = (SegmentBuilder **)(pwVar6 + (local_68->super_SegmentReader).ptr.size_),
              lVar14 < (long)pwVar6 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar17 - (long)ppSVar1 >> 3 < lVar14)))) goto LAB_0020e130;
          ppSVar17 = ppSVar1 + lVar14;
          goto LAB_0020e13d;
        }
        _kjCondition.left = (SegmentReader **)&local_68;
        (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_0020e130:
    if (ppSVar17 == (SegmentBuilder **)0x0) goto LAB_0020e255;
    uVar10 = (uint)(this->tag).content;
LAB_0020e13d:
    bVar18 = (uVar10 & 3) == 0;
    _kjCondition.left = (SegmentReader **)((ulong)uVar10 & 0xffffffff00000003);
    _kjCondition.right = anon_var_dwarf_b08b;
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar18);
    if (bVar18) {
      if (local_68 == (SegmentBuilder *)0x0) {
        local_68 = (SegmentBuilder *)0x0;
LAB_0020e3aa:
        uVar2 = *(ushort *)((long)&(this->tag).content + 4);
        SVar3 = *(StructPointerCount *)((long)&(this->tag).content + 6);
        __return_storage_ptr__->segment = &local_68->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar4;
        __return_storage_ptr__->data = ppSVar17;
        __return_storage_ptr__->pointers = (WirePointer *)(ppSVar17 + uVar2);
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = SVar3;
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        return __return_storage_ptr__;
      }
      uVar13 = (ulong)*(ushort *)((long)&(this->tag).content + 4) +
               (ulong)*(ushort *)((long)&(this->tag).content + 6);
      if (((long)ppSVar17 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) + uVar13 <=
          (local_68->super_SegmentReader).ptr.size_) {
        pRVar5 = (local_68->super_SegmentReader).readLimiter;
        uVar15 = pRVar5->limit;
        if (uVar13 <= uVar15) {
          pRVar5->limit = uVar15 - uVar13;
          goto LAB_0020e3aa;
        }
        (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[322]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x89e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                 "_kjCondition,\"Message contained out-of-bounds struct pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [322])
                 "Message contained out-of-bounds struct pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[87]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x898,FAILED,"ref->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer\" \"was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [87])
                 "Schema mismatch: Message contains non-struct pointer where struct pointerwas expected."
                );
    }
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
LAB_0020e255:
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->pointers = (WirePointer *)0x0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

StructReader OrphanBuilder::asStructReader(StructSize size) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readStructPointer(
      segment, capTable, tagAsPtr(), location, nullptr, kj::maxValue);
}